

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_getdate.c
# Opt level: O0

void test_archive_getdate(void)

{
  char *pcVar1;
  char *e1;
  time_t v1;
  time_t tVar2;
  void *in_stack_00000010;
  time_t now;
  char *in_stack_00001120;
  time_t in_stack_00001128;
  char *in_stack_ffffffffffffffe0;
  longlong in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  wchar_t wVar3;
  
  wVar3 = (wchar_t)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  pcVar1 = (char *)time((time_t *)0x0);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,0,
                      (char *)0x124f02,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,0,
                      (char *)0x124f45,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,0,
                      (char *)0x124f88,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,0,
                      (char *)0x124fcb,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,0,
                      (char *)0x12500e,in_stack_00000010);
  e1 = (char *)__archive_get_date(in_stack_00001128,in_stack_00001120);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,in_stack_ffffffffffffffe8,e1,0,(char *)0x125066,in_stack_00000010
                     );
  v1 = __archive_get_date(in_stack_00001128,in_stack_00001120);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x1250be,in_stack_00000010);
  tVar2 = __archive_get_date(in_stack_00001128,in_stack_00001120);
  wVar3 = (wchar_t)((ulong)tVar2 >> 0x20);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x125116,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x125159,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x12519b,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x1251de,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x125220,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x125262,in_stack_00000010);
  pcVar1 = (char *)0x49614d80;
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x1252ac,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x1252f5,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x12533e,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x125387,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x1253d4,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x12542b,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x125482,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x1254c4,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x12550d,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x125556,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x12559f,in_stack_00000010);
  __archive_get_date(in_stack_00001128,in_stack_00001120);
  assertion_equal_int(pcVar1,wVar3,v1,e1,0,(char *)0x1255e8,in_stack_00000010);
  return;
}

Assistant:

DEFINE_TEST(test_archive_getdate)
{
	time_t now = time(NULL);

	assertEqualInt(get_date(now, "Jan 1, 1970 UTC"), 0);
	assertEqualInt(get_date(now, "7:12:18-0530 4 May 1983"), 420900138);
	assertEqualInt(get_date(now, "2004/01/29 513 mest"), 1075345980);
	assertEqualInt(get_date(now, "99/02/17 7pm utc"), 919278000);
	assertEqualInt(get_date(now, "02/17/99 7:11am est"), 919253460);
	assertEqualInt(get_date(now, "now - 2 hours"),
	    get_date(now, "2 hours ago"));
	assertEqualInt(get_date(now, "2 hours ago"),
	    get_date(now, "+2 hours ago"));
	assertEqualInt(get_date(now, "now - 2 hours"),
	    get_date(now, "-2 hours"));
	/* It's important that we handle ctime() format. */
	assertEqualInt(get_date(now, "Sun Feb 22 17:38:26 PST 2009"),
	    1235353106);
	/* Basic relative offsets. */
	/* If we use the actual current time as the reference, then
	 * these tests break around DST changes, so it's actually
	 * important to use a specific reference time here. */
	assertEqualInt(get_date(0, "tomorrow"), 24 * 60 * 60);
	assertEqualInt(get_date(0, "yesterday"), - 24 * 60 * 60);
	assertEqualInt(get_date(0, "now + 1 hour"), 60 * 60);
	assertEqualInt(get_date(0, "now + 1 hour + 1 minute"), 60 * 60 + 60);
	/* Repeat the above for a different start time. */
	now = 1231113600; /* Jan 5, 2009 00:00 UTC */
	assertEqualInt(get_date(0, "Jan 5, 2009 00:00 UTC"), now);
	assertEqualInt(get_date(now, "tomorrow"), now + 24 * 60 * 60);
	assertEqualInt(get_date(now, "yesterday"), now - 24 * 60 * 60);
	assertEqualInt(get_date(now, "now + 1 hour"), now + 60 * 60);
	assertEqualInt(get_date(now, "now + 1 hour + 1 minute"),
	    now + 60 * 60 + 60);
	assertEqualInt(get_date(now, "tomorrow 5:16am UTC"),
	    now + 24 * 60 * 60 + 5 * 60 * 60 + 16 * 60);
	assertEqualInt(get_date(now, "UTC 5:16am tomorrow"),
	    now + 24 * 60 * 60 + 5 * 60 * 60 + 16 * 60);

	/* Jan 5, 2009 was a Monday. */
	assertEqualInt(get_date(now, "monday UTC"), now);
	assertEqualInt(get_date(now, "sunday UTC"), now + 6 * 24 * 60 * 60);
	assertEqualInt(get_date(now, "tuesday UTC"), now + 24 * 60 * 60);
	/* "next tuesday" is one week after "tuesday" */
	assertEqualInt(get_date(now, "UTC next tuesday"),
	    now + 8 * 24 * 60 * 60);
	/* "last tuesday" is one week before "tuesday" */
	assertEqualInt(get_date(now, "last tuesday UTC"),
	    now - 6 * 24 * 60 * 60);
	/* TODO: Lots more tests here. */
}